

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall
DialogPrompt::DialogPrompt
          (DialogPrompt *this,string *dialogText,Color *textColor,uint charSize,float x,float y,
          Color *fillColor,Color *outlineColor,Vector2f *size)

{
  Text *this_00;
  Font *font;
  Vector2f *size_00;
  uint in_ECX;
  Text *in_RSI;
  locale *in_RDI;
  string *ansiString;
  Text *this_01;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Vector2f *in_stack_ffffffffffffff38;
  Color *color;
  RectangleShape *in_stack_ffffffffffffff40;
  Text *in_stack_ffffffffffffff50;
  String *in_stack_ffffffffffffff80;
  Color local_78 [11];
  Vector2<float> local_4c [5];
  float local_24;
  float local_20;
  uint local_1c;
  Text *local_10;
  
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  local_1c = in_ECX;
  local_10 = in_RSI;
  UIComponent::UIComponent((UIComponent *)in_stack_ffffffffffffff40);
  *(undefined ***)in_RDI = &PTR__DialogPrompt_002bc2c0;
  *(undefined **)(in_RDI + 8) = &DAT_002bc2f8;
  ansiString = (string *)(in_RDI + 0xb8);
  sf::Text::Text(in_stack_ffffffffffffff50);
  sf::Vector2<float>::Vector2(local_4c,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_01 = (Text *)(in_RDI + 0x380);
  std::vector<TextButton,_std::allocator<TextButton>_>::vector
            ((vector<TextButton,_std::allocator<TextButton>_> *)0x1aa52e);
  std::vector<TextField,_std::allocator<TextField>_>::vector
            ((vector<TextField,_std::allocator<TextField>_> *)0x1aa544);
  std::vector<CheckBox,_std::allocator<CheckBox>_>::vector
            ((vector<CheckBox,_std::allocator<CheckBox>_> *)0x1aa55a);
  this_00 = (Text *)(in_RDI + 0xb8);
  font = Board::getFont();
  sf::Text::setFont(this_00,font);
  size_00 = (Vector2f *)(in_RDI + 0xb8);
  color = local_78;
  std::locale::locale((locale *)color);
  sf::String::String(in_stack_ffffffffffffff80,ansiString,in_RDI);
  sf::Text::setString(local_10,(String *)size_00);
  sf::String::~String((String *)0x1aa5e2);
  std::locale::~locale((locale *)local_78);
  sf::Text::setFillColor(this_01,color);
  sf::Text::setCharacterSize((Text *)(in_RDI + 0xb8),local_1c);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0xc0),10.0,5.0);
  sf::RectangleShape::setSize((RectangleShape *)local_10,size_00);
  sf::Shape::setFillColor((Shape *)local_10,(Color *)size_00);
  sf::Shape::setOutlineColor((Shape *)local_10,(Color *)size_00);
  sf::Shape::setOutlineThickness((Shape *)local_10,(float)((ulong)size_00 >> 0x20));
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x230),0.0,0.0);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 8),local_20,local_24);
  in_RDI[0xb1] = (locale)0x0;
  std::vector<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>::push_back
            ((vector<DialogPrompt_*,_std::allocator<DialogPrompt_*>_> *)local_10,
             (value_type *)size_00);
  return;
}

Assistant:

DialogPrompt::DialogPrompt(const string& dialogText, const Color& textColor, unsigned int charSize, float x, float y, const Color& fillColor, const Color& outlineColor, const Vector2f& size) {
    text.setFont(Board::getFont());
    text.setString(dialogText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(10.0f, 5.0f);
    
    background.setSize(size);
    background.setFillColor(fillColor);
    background.setOutlineColor(outlineColor);
    background.setOutlineThickness(-2.0f);
    background.setPosition(0.0f, 0.0f);
    
    setPosition(x, y);
    visible = false;
    UserInterface::_dialogPrompts.push_back(this);
}